

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O0

void __thiscall TempData::start(TempData *this)

{
  bool bVar1;
  uint uVar2;
  path *ppVar3;
  char *pcVar4;
  string *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  ulong local_88;
  size_t i;
  char *local_78;
  char *local_70;
  char *local_68;
  size_t local_60;
  size_t equCount;
  size_t labelCount;
  size_t lineCount;
  size_t fileCount;
  string local_30;
  TempData *local_10;
  TempData *this_local;
  
  local_10 = this;
  ppVar3 = TextFile::getFileName(&this->file);
  bVar1 = ghc::filesystem::path::empty(ppVar3);
  if (!bVar1) {
    uVar2 = TextFile::open(&this->file,(char *)0x1,5);
    if ((uVar2 & 1) == 0) {
      ppVar3 = TextFile::getFileName(&this->file);
      ghc::filesystem::path::u8string_abi_cxx11_(&local_30,ppVar3);
      Logger::printError<std::__cxx11::string>((Logger *)0x1,0x221a15,(char *)&local_30,in_RCX);
      std::__cxx11::string::~string((string *)&local_30);
    }
    else {
      lineCount = FileList::size(&Global.fileList);
      labelCount = (size_t)Global.FileInfo.TotalLineCount;
      equCount = SymbolTable::getLabelCount(&Global.symbolTable);
      local_60 = SymbolTable::getEquationCount(&Global.symbolTable);
      local_68 = "files";
      if (lineCount == 1) {
        local_68 = "file";
      }
      TextFile::writeFormat<unsigned_long,char_const*>
                (&this->file,"; %d %S included\n",&lineCount,&local_68);
      local_70 = "lines";
      if (labelCount == 1) {
        local_70 = "line";
      }
      TextFile::writeFormat<unsigned_long,char_const*>
                (&this->file,"; %d %S\n",&labelCount,&local_70);
      local_78 = "labels";
      if (equCount == 1) {
        local_78 = "label";
      }
      TextFile::writeFormat<unsigned_long,char_const*>(&this->file,"; %d %S\n",&equCount,&local_78);
      pcVar4 = "equations";
      if (local_60 == 1) {
        pcVar4 = "equation";
      }
      i = (size_t)pcVar4;
      TextFile::writeFormat<unsigned_long,char_const*>
                (&this->file,"; %d %S\n\n",&local_60,(char **)&i);
      for (local_88 = 0; local_88 < lineCount; local_88 = local_88 + 1) {
        args = FileList::string_abi_cxx11_(&Global.fileList,(int)local_88);
        TextFile::writeFormat<std::__cxx11::string>(&this->file,"; %S\n",args);
      }
      TextFile::writeLine(&this->file,"");
    }
  }
  return;
}

Assistant:

void TempData::start()
{
	if (!file.getFileName().empty())
	{
		if (!file.open(TextFile::Write))
		{
			Logger::printError(Logger::Error,"Could not open temp file %s.",file.getFileName().u8string());
			return;
		}

		size_t fileCount = Global.fileList.size();
		size_t lineCount = Global.FileInfo.TotalLineCount;
		size_t labelCount = Global.symbolTable.getLabelCount();
		size_t equCount = Global.symbolTable.getEquationCount();

		file.writeFormat("; %d %S included\n",fileCount,fileCount == 1 ? "file" : "files");
		file.writeFormat("; %d %S\n",lineCount,lineCount == 1 ? "line" : "lines");
		file.writeFormat("; %d %S\n",labelCount,labelCount == 1 ? "label" : "labels");
		file.writeFormat("; %d %S\n\n",equCount,equCount == 1 ? "equation" : "equations");
		for (size_t i = 0; i < fileCount; i++)
		{
			file.writeFormat("; %S\n",Global.fileList.string(int(i)));
		}
		file.writeLine("");
	}
}